

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O0

HaltonSampler *
pbrt::HaltonSampler::Create
          (ParameterDictionary *parameters,Point2i fullResolution,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  HaltonSampler *pHVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string s;
  RandomizeStrategy randomizer;
  int seed;
  int nsamp;
  string *in_stack_fffffffffffffea8;
  ParameterDictionary *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebc;
  undefined1 in_stack_fffffffffffffebd;
  undefined1 in_stack_fffffffffffffebe;
  Point2<int> *args_1;
  undefined4 in_stack_fffffffffffffed8;
  allocator<char> *in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  char *in_stack_fffffffffffffee8;
  allocator<char> *__s;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  string *name;
  ParameterDictionary *in_stack_ffffffffffffff08;
  string local_f0 [39];
  undefined8 local_c9;
  string local_a8 [32];
  undefined4 local_88;
  allocator<char> local_81;
  string local_80 [32];
  int local_60;
  undefined1 local_49 [37];
  int local_24;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  name = (string *)local_49;
  local_18 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),in_stack_fffffffffffffee8
             ,in_stack_fffffffffffffee0);
  iVar3 = ParameterDictionary::GetOneInt(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,0);
  std::__cxx11::string::~string((string *)(local_49 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_49);
  local_24 = iVar3;
  bVar1 = pstd::optional::operator_cast_to_bool((optional *)(Options + 0x44));
  if (bVar1) {
    piVar5 = pstd::optional<int>::operator*((optional<int> *)0x82a3df);
    local_24 = *piVar5;
  }
  __s = &local_81;
  args = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(iVar3,in_stack_fffffffffffffef0),(char *)__s,(allocator<char> *)args);
  iVar4 = ParameterDictionary::GetOneInt(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,0);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  if ((*(byte *)(Options + 0x54) & 1) != 0) {
    local_24 = 1;
  }
  args_1 = (Point2<int> *)&local_c9;
  local_60 = iVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(iVar3,in_stack_fffffffffffffef0),(char *)__s,(allocator<char> *)args);
  piVar5 = (int *)&stack0xffffffffffffff0f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(iVar3,in_stack_fffffffffffffef0),(char *)__s,(allocator<char> *)args);
  ParameterDictionary::GetOneString(in_stack_ffffffffffffff08,name,in_RDI);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff0f);
  std::__cxx11::string::~string((string *)((long)&local_c9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8);
  if ((bool)uVar2) {
    local_88 = 0;
  }
  else {
    in_stack_fffffffffffffebe =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8);
    if ((bool)in_stack_fffffffffffffebe) {
      local_88 = 1;
    }
    else {
      in_stack_fffffffffffffebd =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8);
      if ((bool)in_stack_fffffffffffffebd) {
        ErrorExit<>((char *)args);
      }
      in_stack_fffffffffffffebc =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8);
      if (!(bool)in_stack_fffffffffffffebc) {
        ErrorExit<std::__cxx11::string&>
                  ((FileLoc *)CONCAT44(iVar3,in_stack_fffffffffffffef0),(char *)__s,args);
      }
      local_88 = 3;
    }
  }
  pHVar6 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::HaltonSampler,int&,pbrt::Point2<int>&,pbrt::RandomizeStrategy&,int&,pstd::pmr::polymorphic_allocator<std::byte>&>
                     ((polymorphic_allocator<std::byte> *)args,
                      (int *)CONCAT44(iVar4,in_stack_fffffffffffffed8),args_1,
                      (RandomizeStrategy *)local_18,piVar5,
                      (polymorphic_allocator<std::byte> *)
                      CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffebe,
                                              CONCAT15(in_stack_fffffffffffffebd,
                                                       CONCAT14(in_stack_fffffffffffffebc,
                                                                in_stack_fffffffffffffeb8)))));
  std::__cxx11::string::~string(local_a8);
  return pHVar6;
}

Assistant:

HaltonSampler *HaltonSampler::Create(const ParameterDictionary &parameters,
                                     Point2i fullResolution, const FileLoc *loc,
                                     Allocator alloc) {
    int nsamp = parameters.GetOneInt("pixelsamples", 16);
    if (Options->pixelSamples)
        nsamp = *Options->pixelSamples;
    int seed = parameters.GetOneInt("seed", Options->seed);
    if (Options->quickRender)
        nsamp = 1;

    RandomizeStrategy randomizer;
    std::string s = parameters.GetOneString("randomization", "permutedigits");
    if (s == "none")
        randomizer = RandomizeStrategy::None;
    else if (s == "permutedigits")
        randomizer = RandomizeStrategy::PermuteDigits;
    else if (s == "fastowen")
        ErrorExit("\"fastowen\" randomization not supported by Halton sampler.");
    else if (s == "owen")
        randomizer = RandomizeStrategy::Owen;
    else
        ErrorExit(loc, "%s: unknown randomization strategy given to HaltonSampler", s);

    return alloc.new_object<HaltonSampler>(nsamp, fullResolution, randomizer, seed,
                                           alloc);
}